

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

bool operator==(CESkyCoord *lhs,CESkyCoord *rhs)

{
  CESkyCoordType CVar1;
  CESkyCoordType CVar2;
  CESkyCoord *in_RSI;
  CESkyCoord *in_RDI;
  double dVar3;
  double marcsec_rad;
  CEAngle angsep;
  bool are_equal;
  CESkyCoord *in_stack_000001f0;
  CESkyCoord *in_stack_000001f8;
  undefined4 in_stack_ffffffffffffffa0;
  CEAngle local_40;
  double *local_30;
  CEAngle local_28;
  byte local_11;
  CESkyCoord *local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  CVar1 = CESkyCoord::GetCoordSystem(in_RDI);
  CVar2 = CESkyCoord::GetCoordSystem(local_10);
  if (CVar1 == CVar2) {
    CESkyCoord::AngularSeparation(in_stack_000001f8,in_stack_000001f0);
    local_30 = (double *)CEAngle::operator_cast_to_double(&local_40);
    CEAngle::CEAngle((CEAngle *)CONCAT44(CVar1,in_stack_ffffffffffffffa0),local_30);
    CEAngle::~CEAngle((CEAngle *)0x144001);
    dVar3 = CEAngle::operator_cast_to_double(&local_28);
    if (1.4544e-05 < dVar3) {
      local_11 = 0;
    }
    CEAngle::~CEAngle((CEAngle *)0x14407f);
  }
  else {
    local_11 = 0;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool operator==(const CESkyCoord& lhs, const CESkyCoord& rhs)
{
    bool are_equal = true;
    
    // Check the coordinate systems are equivalent
    if (lhs.GetCoordSystem() != rhs.GetCoordSystem()) {
        are_equal = false;
    }
    // Check that the x-coordinate and the y-coordinate are the same
    else {
        // Check how far appart the coordinates are from each other
        CEAngle angsep = CESkyCoord::AngularSeparation(lhs, rhs);
        // Currently require separation < 0.03 arcsec
        double marcsec_rad = 4.848e-6;
        if (angsep > 3.0*marcsec_rad) {
            are_equal = false;
        }
    }

    return are_equal;
}